

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvref_common.h
# Opt level: O0

void av1_find_ref_dv(int_mv *ref_dv,TileInfo *tile,int mib_size,int mi_row)

{
  int in_ECX;
  int in_EDX;
  int_mv *in_RSI;
  short *in_RDI;
  
  if (in_ECX - in_EDX < (int)in_RSI->as_int) {
    *in_RDI = 0;
    in_RDI[1] = (short)in_EDX * -4 + -0x100;
  }
  else {
    *in_RDI = (short)in_EDX * -4;
    in_RDI[1] = 0;
  }
  convert_fullmv_to_mv(in_RSI);
  return;
}

Assistant:

static inline void av1_find_ref_dv(int_mv *ref_dv, const TileInfo *const tile,
                                   int mib_size, int mi_row) {
  if (mi_row - mib_size < tile->mi_row_start) {
    ref_dv->as_fullmv.row = 0;
    ref_dv->as_fullmv.col = -MI_SIZE * mib_size - INTRABC_DELAY_PIXELS;
  } else {
    ref_dv->as_fullmv.row = -MI_SIZE * mib_size;
    ref_dv->as_fullmv.col = 0;
  }
  convert_fullmv_to_mv(ref_dv);
}